

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectAnimation(XFileParser *this,Animation *pAnim)

{
  bool bVar1;
  AnimBone *this_00;
  long lVar2;
  Logger *this_01;
  string local_a0;
  int local_80;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string objectName;
  AnimBone *pAStack_20;
  bool running;
  AnimBone *banim;
  Animation *pAnim_local;
  XFileParser *this_local;
  
  banim = (AnimBone *)pAnim;
  pAnim_local = (Animation *)this;
  readHeadOfDataObject(this,(string *)0x0);
  this_00 = (AnimBone *)operator_new(0x80);
  XFile::AnimBone::AnimBone(this_00);
  pAStack_20 = this_00;
  std::vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>::push_back
            ((vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_> *)
             &banim->mPosKeys,&stack0xffffffffffffffe0);
  objectName.field_2._M_local_buf[0xf] = '\x01';
  while( true ) {
    if ((objectName.field_2._M_local_buf[0xf] & 1U) == 0) {
      return;
    }
    GetNextToken_abi_cxx11_((string *)local_48,this);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"}");
    if (bVar1) {
      local_80 = 3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"AnimationKey");
      if (bVar1) {
        ParseDataObjectAnimationKey(this,pAStack_20);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"AnimationOptions");
        if (bVar1) {
          ParseUnknownDataObject(this);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"{");
          if (bVar1) {
            GetNextToken_abi_cxx11_(&local_a0,this);
            std::__cxx11::string::operator=((string *)pAStack_20,(string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            CheckForClosingBrace(this);
          }
          else {
            this_01 = DefaultLogger::get();
            Logger::warn(this_01,"Unknown data object in animation in x file");
            ParseUnknownDataObject(this);
          }
        }
      }
      local_80 = 0;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (local_80 != 0) {
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Unexpected end of file while parsing animation.",&local_69);
  ThrowException(this,&local_68);
}

Assistant:

void XFileParser::ParseDataObjectAnimation( Animation* pAnim)
{
    readHeadOfDataObject();
    AnimBone* banim = new AnimBone;
    pAnim->mAnims.push_back( banim);

    bool running = true;
    while( running )
    {
        std::string objectName = GetNextToken();

        if( objectName.length() == 0)
            ThrowException( "Unexpected end of file while parsing animation.");
        else
        if( objectName == "}")
            break; // animation finished
        else
        if( objectName == "AnimationKey")
            ParseDataObjectAnimationKey( banim);
        else
        if( objectName == "AnimationOptions")
            ParseUnknownDataObject(); // not interested
        else
        if( objectName == "{")
        {
            // read frame name
            banim->mBoneName = GetNextToken();
            CheckForClosingBrace();
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in animation in x file");
            ParseUnknownDataObject();
        }
    }
}